

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void LodePNGText_cleanup(LodePNGInfo *info)

{
  long in_RDI;
  size_t i;
  undefined8 local_10;
  
  for (local_10 = 0; local_10 != *(long *)(in_RDI + 0x48); local_10 = local_10 + 1) {
    string_cleanup((char **)0x5d713c);
    string_cleanup((char **)0x5d7156);
  }
  lodepng_free((void *)0x5d7174);
  lodepng_free((void *)0x5d7182);
  return;
}

Assistant:

static void LodePNGText_cleanup(LodePNGInfo* info)
{
  size_t i;
  for(i = 0; i != info->text_num; ++i)
  {
    string_cleanup(&info->text_keys[i]);
    string_cleanup(&info->text_strings[i]);
  }
  lodepng_free(info->text_keys);
  lodepng_free(info->text_strings);
}